

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O0

bool __thiscall icu_63::double_conversion::Double::LowerBoundaryIsCloser(Double *this)

{
  int iVar1;
  uint64_t uVar2;
  undefined1 local_12;
  bool physical_significand_is_zero;
  Double *this_local;
  
  uVar2 = AsUint64(this);
  local_12 = false;
  if ((uVar2 & 0xfffffffffffff) == 0) {
    iVar1 = Exponent(this);
    local_12 = iVar1 != -0x432;
  }
  return local_12;
}

Assistant:

bool LowerBoundaryIsCloser() const {
    // The boundary is closer if the significand is of the form f == 2^p-1 then
    // the lower boundary is closer.
    // Think of v = 1000e10 and v- = 9999e9.
    // Then the boundary (== (v - v-)/2) is not just at a distance of 1e9 but
    // at a distance of 1e8.
    // The only exception is for the smallest normal: the largest denormal is
    // at the same distance as its successor.
    // Note: denormals have the same exponent as the smallest normals.
    bool physical_significand_is_zero = ((AsUint64() & kSignificandMask) == 0);
    return physical_significand_is_zero && (Exponent() != kDenormalExponent);
  }